

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::Shaft::Encode(Shaft *this,KDataStream *stream)

{
  KDataStream::Write<short>(stream,this->m_i16CurrentRPM);
  KDataStream::Write<short>(stream,this->m_i16OrderedRPM);
  KDataStream::Write<int>(stream,this->m_i32RPMRateOfChange);
  return;
}

Assistant:

void Shaft::Encode( KDataStream & stream ) const
{
    stream << m_i16CurrentRPM
           << m_i16OrderedRPM
           << m_i32RPMRateOfChange;
}